

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

linfdef * linfini(mcmcxdef *mctx,errcxdef *ec,char *filename,int flen,tokpdef *path,
                 int must_find_file,int new_line_records)

{
  char cVar1;
  int iVar2;
  FILE *fp;
  linfdef *linf;
  size_t sVar3;
  tokpdef fakepath;
  char fbuf [4097];
  tokpdef local_1048;
  char local_1038 [4104];
  
  if (path == (tokpdef *)0x0) {
    path = &local_1048;
    local_1048.tokpnxt = (tokpdef *)0x0;
    local_1048.tokplen = 0;
  }
  do {
    iVar2 = path->tokplen;
    sVar3 = (size_t)iVar2;
    if (sVar3 == 0) {
      iVar2 = 0;
    }
    else {
      memcpy(local_1038,path->tokpdir,sVar3);
      cVar1 = local_1038[sVar3 - 1];
      if ((cVar1 != '\0') && (cVar1 != '/')) {
        local_1038[sVar3] = '/';
        iVar2 = iVar2 + 1;
      }
    }
    memcpy(local_1038 + iVar2,filename,(long)flen);
    local_1038[iVar2 + flen] = '\0';
    fp = fopen(local_1038,"r");
    if (fp != (FILE *)0x0) goto LAB_0011569b;
    path = path->tokpnxt;
  } while (path != (tokpdef *)0x0);
  iVar2 = os_locate(filename,flen,(char *)0x0,local_1038,0x1001);
  if ((iVar2 == 0) || (fp = fopen(local_1038,"r"), fp == (FILE *)0x0)) {
    iVar2 = dbgu_find_src(filename,flen,local_1038,0x1001,must_find_file);
    if (iVar2 != 0) {
      if (local_1038[0] == '\0') {
        fp = (FILE *)0x0;
      }
      else {
        fp = fopen(local_1038,"r");
      }
      if (must_find_file == 0 || fp != (FILE *)0x0) goto LAB_0011569b;
    }
    linf = (linfdef *)0x0;
  }
  else {
LAB_0011569b:
    if (fp == (FILE *)0x0) {
      local_1038[0] = '\0';
      iVar2 = 0x1001;
    }
    else {
      sVar3 = strlen(local_1038);
      iVar2 = (int)sVar3;
    }
    linf = (linfdef *)mchalo(ec,(ulong)(flen + iVar2 + 0x271U & 0xffff),"linfini");
    linfini2(mctx,linf,filename,flen,(osfildef *)fp,new_line_records);
    memcpy(linf->linfnam + (long)flen + 1,local_1038,(long)iVar2);
    linf->linfnam[flen + iVar2 + 1] = '\0';
    memset(linf->linfpg,0xff,0x100);
  }
  return linf;
}

Assistant:

linfdef *linfini(mcmcxdef *mctx, errcxdef *ec, char *filename,
                 int flen, tokpdef *path, int must_find_file,
                 int new_line_records)
{
    int       i;
    objnum   *objp;
    linfdef  *linf;
    osfildef *fp;
    char      fbuf[OSFNMAX + 1];
    tokpdef   fakepath;
    int       len;
    
    if (!path)
    {
        path = &fakepath;
        fakepath.tokpnxt = (tokpdef *)0;
        fakepath.tokplen = 0;
    }

    /* search through the path list */
    for ( ; path ; path = path->tokpnxt)
    {
        char last;

        /* prefix the current path */
        if ((len = path->tokplen) != 0)
        {
            memcpy(fbuf, path->tokpdir, (size_t)len);
            last = fbuf[len - 1];
            if (last == OSPATHCHAR ||
                (OSPATHALT && strchr(OSPATHALT, last)))
                /* do nothing */ ;
            else
            {
                /* append path separator character */
                fbuf[len++] = OSPATHCHAR;
            }
        }

        /* add the filename and null-terminate */
        memcpy(fbuf + len, filename, (size_t)flen);
        fbuf[len + flen] = '\0';
        
        /* attempt to open this file */
        if ((fp = osfoprs(fbuf, OSFTTEXT)) != 0)
            break;
    }

    /* 
     *   If no file opened yet, search tads path; if that doesn't work,
     *   let the debugger UI try to find the file.  If nothing works, give
     *   up and return failure.  
     */
    if (fp == 0
        && (!os_locate(filename, flen, (char *)0, fbuf, sizeof(fbuf))
            || (fp = osfoprs(fbuf, OSFTTEXT)) == 0))
    {
        /*
         *   Ask the debugger UI for advice.  If the debugger isn't
         *   present, we'll get a failure code from this routine. 
         */
        if (!dbgu_find_src(filename, flen, fbuf, sizeof(fbuf),
                           must_find_file))
            return 0;

        /* try opening the file */
        if (fbuf[0] == '\0')
        {
            /* 
             *   we didn't get a filename - the UI wants to defer finding
             *   the file until later 
             */
            fp = 0;
        }
        else
        {
            /* we got a filename from the UI - try opening it */
            fp = osfoprs(fbuf, OSFTTEXT);
        }

        /* 
         *   if the file isn't present, and we're required to find it,
         *   return failure 
         */
        if (fp == 0 && must_find_file)
            return 0;
    }
    
    /* figure out how much space we need for the file's full name */
    if (fp == 0)
    {
        /* 
         *   we didn't find the file, so we don't yet know its name - use
         *   the maximum possible filename length for the buffer size, so
         *   that we can store the final filename if we should figure out
         *   where the file is later on 
         */
        fbuf[0] = '\0';
        len = sizeof(fbuf);
    }
    else
    {
        /* 
         *   we found the file, so we have its final name - allocate space
         *   for the known name 
         */
        len = (int)strlen(fbuf);
    }

    /* allocate the linfdef */
    linf = (linfdef *)mchalo(ec, (ushort)(sizeof(linfdef) + flen
                                          + len + 1), "linfini");

    /* do the basic initialization */
    linfini2(mctx, linf, filename, flen, fp, new_line_records);

    memcpy(linf->linfnam + flen + 1, fbuf, (size_t)len);
    linf->linfnam[flen + 1 + len] = '\0';
    
    /* set all debugger pages to not-yet-allocated */
    for (i = LINFPGMAX, objp = linf->linfpg ; i ; ++objp, --i)
        *objp = MCMONINV;

    /* return the new line source object */
    return linf;
}